

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::AddEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  uint32 uVar2;
  ulong uVar3;
  int iVar4;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    iVar4 = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_28,&local_30);
    }
    internal::ExtensionSet::AddEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),iVar4,
               (FieldType)field[0x38],*(bool *)(*(long *)(field + 0x78) + 0x4c),value,field);
  }
  else {
    uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar3 = (ulong)uVar2;
    this_00 = (RepeatedField<int> *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
    iVar4 = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
    if (iVar4 == *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3 + 4)) {
      RepeatedField<int>::Reserve(this_00,iVar4 + 1);
      iVar4 = this_00->current_size_;
    }
    this_00->current_size_ = iVar4 + 1;
    *(int *)((long)this_00->arena_or_elements_ + (long)iVar4 * 4) = value;
  }
  return;
}

Assistant:

void Reflection::AddEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(), value,
                                          field);
  } else {
    AddField<int>(message, field, value);
  }
}